

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void delete_statement(Context_conflict *ctx,MOJOSHADER_astStatement *stmt)

{
  MOJOSHADER_astStatement *pMVar1;
  MOJOSHADER_astStatement *pMVar2;
  MOJOSHADER_astExpression *_expr;
  
  if (stmt == (MOJOSHADER_astStatement *)0x0) {
    return;
  }
  pMVar2 = stmt->next;
  stmt->next = (MOJOSHADER_astStatement *)0x0;
  while (pMVar2 != (MOJOSHADER_astStatement *)0x0) {
    pMVar1 = pMVar2->next;
    pMVar2->next = (MOJOSHADER_astStatement *)0x0;
    delete_statement(ctx,pMVar2);
    pMVar2 = pMVar1;
  }
  switch((stmt->ast).type) {
  case MOJOSHADER_AST_STATEMENT_BLOCK:
    delete_statement(ctx,*(MOJOSHADER_astStatement **)&stmt[1].ast);
  case MOJOSHADER_AST_STATEMENT_EMPTY:
  case MOJOSHADER_AST_STATEMENT_BREAK:
  case MOJOSHADER_AST_STATEMENT_CONTINUE:
  case MOJOSHADER_AST_STATEMENT_DISCARD:
    pMVar2 = stmt->next;
    goto LAB_0012cb10;
  case MOJOSHADER_AST_STATEMENT_EXPRESSION:
  case MOJOSHADER_AST_STATEMENT_RETURN:
    delete_statement(ctx,stmt->next);
    _expr = *(MOJOSHADER_astExpression **)&stmt[1].ast;
    goto LAB_0012cb51;
  case MOJOSHADER_AST_STATEMENT_IF:
    delete_statement(ctx,stmt->next);
    delete_expr(ctx,(MOJOSHADER_astExpression *)stmt[1].ast.filename);
    delete_statement(ctx,*(MOJOSHADER_astStatement **)&stmt[1].ast.line);
    pMVar2 = stmt[1].next;
    goto LAB_0012cb10;
  case MOJOSHADER_AST_STATEMENT_SWITCH:
    delete_expr(ctx,(MOJOSHADER_astExpression *)stmt[1].ast.filename);
    delete_switch_case(ctx,*(MOJOSHADER_astSwitchCases **)&stmt[1].ast.line);
    break;
  case MOJOSHADER_AST_STATEMENT_FOR:
    delete_statement(ctx,stmt->next);
    delete_variable_declaration(ctx,(MOJOSHADER_astVariableDeclaration *)stmt[1].ast.filename);
    delete_expr(ctx,*(MOJOSHADER_astExpression **)&stmt[1].ast.line);
    delete_expr(ctx,(MOJOSHADER_astExpression *)stmt[1].next);
    delete_expr(ctx,*(MOJOSHADER_astExpression **)&stmt[2].ast);
    pMVar2 = (MOJOSHADER_astStatement *)stmt[2].ast.filename;
LAB_0012cb10:
    delete_statement(ctx,pMVar2);
    break;
  case MOJOSHADER_AST_STATEMENT_DO:
  case MOJOSHADER_AST_STATEMENT_WHILE:
    delete_statement(ctx,stmt->next);
    delete_statement(ctx,*(MOJOSHADER_astStatement **)&stmt[1].ast.line);
    _expr = (MOJOSHADER_astExpression *)stmt[1].ast.filename;
LAB_0012cb51:
    delete_expr(ctx,_expr);
    break;
  case MOJOSHADER_AST_STATEMENT_TYPEDEF:
    delete_statement(ctx,stmt->next);
    delete_typedef(ctx,*(MOJOSHADER_astTypedef **)&stmt[1].ast);
    break;
  case MOJOSHADER_AST_STATEMENT_STRUCT:
    delete_statement(ctx,stmt->next);
    delete_struct_declaration(ctx,*(MOJOSHADER_astStructDeclaration **)&stmt[1].ast);
    break;
  case MOJOSHADER_AST_STATEMENT_VARDECL:
    delete_statement(ctx,stmt->next);
    delete_variable_declaration(ctx,*(MOJOSHADER_astVariableDeclaration **)&stmt[1].ast);
    break;
  default:
    __assert_fail("0 && \"missing cleanup code\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x5eb,"void delete_statement(Context *, MOJOSHADER_astStatement *)");
  }
  (*ctx->free)(stmt,ctx->malloc_data);
  return;
}

Assistant:

static void delete_statement(Context *ctx, MOJOSHADER_astStatement *stmt)
{
    if (!stmt) return;

    // it's important to not recurse too deeply here, since you may have
    //  thousands of items in this linked list (each line of a massive
    //  function, for example). To avoid this, we iterate the list here,
    //  deleting all children and making them think they have no reason
    //  to recurse in their own delete methods.
    // Please note that everyone should _try_ to delete their "next" member,
    //  just in case, but hopefully this cleaned it out.

    MOJOSHADER_astStatement *i = stmt->next;
    stmt->next = NULL;
    while (i)
    {
        MOJOSHADER_astStatement *next = i->next;
        i->next = NULL;
        delete_statement(ctx, i);
        i = next;
    } // while

    switch (stmt->ast.type)
    {
        #define DELETE_STATEMENT(typ, cls, fn) \
            case MOJOSHADER_AST_STATEMENT_##typ: \
                delete_##fn##_statement(ctx, (cls *) stmt); break;
        DELETE_STATEMENT(BLOCK, MOJOSHADER_astBlockStatement, block);
        DELETE_STATEMENT(EMPTY, MOJOSHADER_astEmptyStatement, empty);
        DELETE_STATEMENT(IF, MOJOSHADER_astIfStatement, if);
        DELETE_STATEMENT(SWITCH, MOJOSHADER_astSwitchStatement, switch);
        DELETE_STATEMENT(EXPRESSION, MOJOSHADER_astExpressionStatement, expr);
        DELETE_STATEMENT(FOR, MOJOSHADER_astForStatement, for);
        DELETE_STATEMENT(DO, MOJOSHADER_astDoStatement, do);
        DELETE_STATEMENT(WHILE, MOJOSHADER_astWhileStatement, while);
        DELETE_STATEMENT(RETURN, MOJOSHADER_astReturnStatement, return);
        DELETE_STATEMENT(BREAK, MOJOSHADER_astBreakStatement, break);
        DELETE_STATEMENT(CONTINUE, MOJOSHADER_astContinueStatement, continue);
        DELETE_STATEMENT(DISCARD, MOJOSHADER_astDiscardStatement, discard);
        DELETE_STATEMENT(TYPEDEF, MOJOSHADER_astTypedefStatement, typedef);
        DELETE_STATEMENT(STRUCT, MOJOSHADER_astStructStatement, struct);
        DELETE_STATEMENT(VARDECL, MOJOSHADER_astVarDeclStatement, vardecl);
        #undef DELETE_STATEMENT
        default: assert(0 && "missing cleanup code"); break;
    } // switch
    // don't free (stmt) here, the class-specific functions do it.
}